

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O2

CURLcode imap_statemach_act(connectdata *conn)

{
  anon_union_224_10_26c073a1_for_proto *pp;
  int *piVar1;
  curl_off_t *pcVar2;
  curl_socket_t sockfd;
  curl_usessl cVar3;
  void *pvVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  _Bool _Var8;
  CURLcode CVar9;
  CURLcode CVar10;
  int iVar11;
  uint uVar12;
  imapstate iVar13;
  size_t sVar14;
  ulong uVar15;
  size_t sVar16;
  char *pcVar17;
  SessionHandle *pSVar18;
  char *pcVar19;
  ulong uStackY_80;
  int imapcode;
  ulong local_68;
  ulong local_60;
  undefined8 local_58;
  SASL *local_40;
  size_t nread;
  
  sockfd = conn->sock[0];
  nread = 0;
  CVar9 = CURLE_NOT_BUILT_IN;
  if ((conn->proto).imapc.state != IMAP_UPGRADETLS) {
    pp = &conn->proto;
    if ((conn->proto).ftpc.pp.sendleft != 0) {
      CVar9 = Curl_pp_flushsend(&(pp->ftpc).pp);
      return CVar9;
    }
    local_40 = &(conn->proto).imapc.sasl;
    do {
      CVar9 = Curl_pp_readresp(sockfd,&(pp->ftpc).pp,&imapcode,&nread);
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      if (imapcode == -1) {
        return CURLE_FTP_WEIRD_SERVER_REPLY;
      }
      if (imapcode == 0) {
        return 0;
      }
      switch((conn->proto).imapc.state) {
      case IMAP_SERVERGREET:
        if (imapcode != 0x4f) {
          Curl_failf(conn->data,"Got unexpected imap-server response");
          return CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        (conn->proto).ftpc.diralloc = 0;
        *(undefined4 *)((long)&conn->proto + 0x8c) = 0;
        (conn->proto).imapc.tls_supported = false;
        CVar9 = imap_sendf(conn,"CAPABILITY");
        iVar13 = IMAP_CAPABILITY;
joined_r0x00122a22:
        if (CVar9 != CURLE_OK) {
          return CVar9;
        }
        (conn->proto).imapc.state = iVar13;
        goto LAB_00122b2a;
      case IMAP_CAPABILITY:
        pSVar18 = conn->data;
        if (imapcode == 0x4f) {
          cVar3 = (pSVar18->set).use_ssl;
          if ((cVar3 != CURLUSESSL_NONE) && (conn->ssl[0].use == false)) {
            if ((conn->proto).imapc.tls_supported == true) {
              CVar9 = imap_sendf(conn,"STARTTLS");
              iVar13 = IMAP_STARTTLS;
              goto joined_r0x00122a22;
            }
            if (cVar3 != CURLUSESSL_TRY) {
              Curl_failf(pSVar18,"STARTTLS not supported.");
              return CURLE_USE_SSL_FAILED;
            }
          }
        }
        else if (imapcode == 0x2a) {
          pcVar19 = (pSVar18->state).buffer + 2;
LAB_0012287a:
          do {
            uVar15 = (ulong)(byte)*pcVar19;
            if (uVar15 < 0x21) {
              if ((0x100002600U >> (uVar15 & 0x3f) & 1) != 0) {
                pcVar19 = pcVar19 + 1;
                goto LAB_0012287a;
              }
              if (uVar15 == 0) goto LAB_00122b18;
            }
            sVar16 = 0xfffffffffffffffb;
            while ((0x20 < (byte)uVar15 || ((0x100002601U >> (uVar15 & 0x3f) & 1) == 0))) {
              lVar6 = sVar16 + 6;
              sVar16 = sVar16 + 1;
              uVar15 = (ulong)(byte)pcVar19[lVar6];
            }
            uStackY_80 = sVar16 + 5;
            if (uStackY_80 == 7) {
              iVar11 = bcmp(pcVar19,"SASL-IR",7);
              if (iVar11 != 0) goto LAB_0012292f;
              (conn->proto).imapc.ir_supported = true;
              uStackY_80 = 7;
            }
            else if (uStackY_80 == 0xd) {
              iVar11 = bcmp(pcVar19,"LOGINDISABLED",0xd);
              if (iVar11 != 0) goto LAB_0012292f;
              (conn->proto).imapc.login_disabled = true;
              uStackY_80 = 0xd;
            }
            else if (uStackY_80 == 8) {
              if (*(long *)pcVar19 != 0x534c545452415453) goto LAB_0012292f;
              (conn->proto).imapc.tls_supported = true;
              uStackY_80 = 8;
            }
            else if (5 < uStackY_80) {
LAB_0012292f:
              iVar11 = bcmp(pcVar19,"AUTH=",5);
              if (iVar11 == 0) {
                pcVar19 = pcVar19 + 5;
                uVar12 = Curl_sasl_decode_mech(pcVar19,sVar16,&local_58);
                uStackY_80 = sVar16;
                if ((uVar12 != 0) && (CONCAT44(local_58._4_4_,(saslprogress)local_58) == sVar16)) {
                  piVar1 = &(conn->proto).ftpc.diralloc;
                  *piVar1 = *piVar1 | uVar12;
                }
              }
            }
            pcVar19 = pcVar19 + uStackY_80;
          } while( true );
        }
        goto LAB_00122b04;
      case IMAP_STARTTLS:
        if (imapcode == 0x4f) {
          return CURLE_NOT_BUILT_IN;
        }
        if ((conn->data->set).use_ssl != CURLUSESSL_TRY) {
          Curl_failf(conn->data,"STARTTLS denied. %c",(ulong)(uint)imapcode);
          return CURLE_USE_SSL_FAILED;
        }
LAB_00122b04:
        CVar10 = imap_perform_authentication(conn);
        break;
      default:
        goto switchD_001226af_caseD_4;
      case IMAP_AUTHENTICATE:
        pSVar18 = conn->data;
        CVar10 = Curl_sasl_continue(local_40,conn,imapcode,(saslprogress *)&local_58);
        if (CVar10 == CURLE_OK) {
          if ((saslprogress)local_58 == SASL_IDLE) {
            if (((conn->proto).imapc.login_disabled != false) ||
               ((*(byte *)((long)&conn->proto + 0x98) & 1) == 0)) {
              pcVar19 = "Authentication cancelled";
              goto LAB_00122ade;
            }
            CVar10 = imap_perform_login(conn);
          }
          else {
            CVar10 = CURLE_OK;
            CVar9 = CURLE_OK;
            if ((saslprogress)local_58 == SASL_DONE) goto LAB_00122ab9;
          }
        }
        break;
      case IMAP_LOGIN:
        if (imapcode != 0x4f) {
          Curl_failf(conn->data,"Access denied. %c",(ulong)(uint)imapcode);
          return CURLE_LOGIN_DENIED;
        }
        goto switchD_001226af_caseD_4;
      case IMAP_LIST:
      case IMAP_SEARCH:
        if (imapcode != 0x2a) {
          if (imapcode != 0x4f) {
            return CURLE_QUOTE_ERROR;
          }
          goto switchD_001226af_caseD_4;
        }
        pSVar18 = conn->data;
        pcVar19 = (pSVar18->state).buffer;
        sVar14 = strlen(pcVar19);
        (pSVar18->state).buffer[sVar14] = '\n';
        CVar10 = Curl_client_write(conn,1,pcVar19,sVar14 + 1);
        (pSVar18->state).buffer[sVar14] = '\0';
        break;
      case IMAP_SELECT:
        pSVar18 = conn->data;
        if (imapcode == 0x4f) {
          pvVar4 = (pSVar18->req).protop;
          if (((*(char **)((long)pvVar4 + 0x10) == (char *)0x0) ||
              (pcVar19 = (conn->proto).imapc.mailbox_uidvalidity, pcVar19 == (char *)0x0)) ||
             (iVar11 = strcmp(*(char **)((long)pvVar4 + 0x10),pcVar19), iVar11 == 0)) {
            pcVar19 = (*Curl_cstrdup)(*(char **)((long)pvVar4 + 8));
            (conn->proto).imapc.mailbox = pcVar19;
            if (*(long *)((long)pvVar4 + 0x38) == 0) {
              if (*(long *)((long)pvVar4 + 0x30) == 0) {
                CVar10 = imap_perform_fetch(conn);
              }
              else {
                CVar10 = imap_perform_search(conn);
              }
            }
            else {
              CVar10 = imap_perform_list(conn);
            }
          }
          else {
            Curl_failf(pSVar18,"Mailbox UIDVALIDITY has changed");
            CVar10 = CURLE_REMOTE_FILE_NOT_FOUND;
          }
        }
        else if (imapcode == 0x2a) {
          CVar10 = CURLE_OK;
          iVar11 = __isoc99_sscanf((pSVar18->state).buffer + 2,"OK [UIDVALIDITY %19[0123456789]]",
                                   &local_58);
          if (iVar11 == 1) {
            (*Curl_cfree)((conn->proto).imapc.mailbox_uidvalidity);
            (conn->proto).imapc.mailbox_uidvalidity = (char *)0x0;
            pcVar19 = (*Curl_cstrdup)((char *)&local_58);
            (conn->proto).imapc.mailbox_uidvalidity = pcVar19;
          }
        }
        else {
          pcVar19 = "Select failed";
LAB_00122ade:
          Curl_failf(pSVar18,pcVar19);
          CVar10 = CURLE_LOGIN_DENIED;
        }
        break;
      case IMAP_FETCH:
        pSVar18 = conn->data;
        if (imapcode == 0x2a) {
          pcVar19 = (pSVar18->state).buffer;
          pcVar17 = (pSVar18->state).buffer;
          while( true ) {
            pcVar17 = pcVar17 + 1;
            if (pcVar17[-1] == '\0') break;
            if (pcVar17[-1] == '{') {
              uVar15 = strtol(pcVar17,(char **)&local_58,10);
              pcVar17 = (char *)CONCAT44(local_58._4_4_,(saslprogress)local_58);
              if ((((1 < (long)pcVar17 - (long)pcVar19) && (*pcVar17 == '}')) &&
                  (pcVar17[1] == '\r')) && (pcVar17[2] == '\0')) {
                Curl_infof(pSVar18,"Found %lu bytes to download\n",uVar15);
                Curl_pgrsSetDownloadSize(pSVar18,uVar15);
                pcVar19 = (pp->ftpc).pp.cache;
                if (pcVar19 != (char *)0x0) {
                  local_68 = (conn->proto).ftpc.pp.cache_size;
                  if (uVar15 <= local_68) {
                    local_68 = uVar15;
                  }
                  local_60 = uVar15;
                  CVar9 = Curl_client_write(conn,1,pcVar19,local_68);
                  uVar15 = local_68;
                  if (CVar9 != CURLE_OK) {
                    return CVar9;
                  }
                  pcVar2 = &(pSVar18->req).bytecount;
                  *pcVar2 = *pcVar2 + local_68;
                  Curl_infof(pSVar18,"Written %lu bytes, %lu bytes are left for transfer\n",local_68
                            );
                  uVar7 = local_68;
                  uVar5 = (conn->proto).ftpc.pp.cache_size;
                  sVar14 = uVar5 - uVar15;
                  if (uVar5 < uVar15 || sVar14 == 0) {
                    (*Curl_cfree)((pp->ftpc).pp.cache);
                    (pp->ftpc).pp.cache = (char *)0x0;
                    sVar16 = 0;
                  }
                  else {
                    memmove((conn->proto).generic,(void *)((long)(conn->proto).generic + local_68),
                            sVar14);
                    sVar16 = (conn->proto).ftpc.pp.cache_size - uVar7;
                  }
                  (conn->proto).ftpc.pp.cache_size = sVar16;
                  uVar15 = local_60;
                }
                if ((pSVar18->req).bytecount == uVar15) {
                  iVar11 = -1;
                  uVar15 = 0xffffffffffffffff;
                }
                else {
                  (pSVar18->req).maxdownload = uVar15;
                  iVar11 = 0;
                }
                Curl_setup_transfer(conn,iVar11,uVar15,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0)
                ;
                CVar9 = CURLE_OK;
                goto LAB_00122ab9;
              }
              break;
            }
            pcVar19 = pcVar19 + 1;
          }
          Curl_failf(((conn->proto).ftpc.pp.conn)->data,"Failed to parse FETCH response.");
          CVar9 = CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        else {
          Curl_pgrsSetDownloadSize(pSVar18,-1);
          CVar9 = CURLE_REMOTE_FILE_NOT_FOUND;
        }
LAB_00122ab9:
        CVar10 = CVar9;
        (conn->proto).imapc.state = IMAP_STOP;
        break;
      case IMAP_FETCH_FINAL:
        if (imapcode != 0x4f) {
          return CURLE_FTP_WEIRD_SERVER_REPLY;
        }
        goto switchD_001226af_caseD_4;
      case IMAP_APPEND:
        if (imapcode != 0x2b) {
          return CURLE_UPLOAD_FAILED;
        }
        Curl_pgrsSetUploadSize(conn->data,(conn->data->state).infilesize);
        Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,0,(curl_off_t *)0x0);
        (conn->proto).imapc.state = IMAP_STOP;
        return CURLE_OK;
      case IMAP_APPEND_FINAL:
        if (imapcode != 0x4f) {
          return CURLE_UPLOAD_FAILED;
        }
switchD_001226af_caseD_4:
        (conn->proto).imapc.state = IMAP_STOP;
        goto LAB_00122cf6;
      }
      if (CVar10 != CURLE_OK) {
        return CVar10;
      }
LAB_00122b18:
      if ((conn->proto).imapc.state == IMAP_STOP) break;
LAB_00122b2a:
      _Var8 = Curl_pp_moredata(&(pp->ftpc).pp);
    } while (_Var8);
LAB_00122cf6:
    CVar9 = CURLE_OK;
  }
  return CVar9;
}

Assistant:

static CURLcode imap_statemach_act(struct connectdata *conn)
{
  CURLcode result = CURLE_OK;
  curl_socket_t sock = conn->sock[FIRSTSOCKET];
  int imapcode;
  struct imap_conn *imapc = &conn->proto.imapc;
  struct pingpong *pp = &imapc->pp;
  size_t nread = 0;

  /* Busy upgrading the connection; right now all I/O is SSL/TLS, not IMAP */
  if(imapc->state == IMAP_UPGRADETLS)
    return imap_perform_upgrade_tls(conn);

  /* Flush any data that needs to be sent */
  if(pp->sendleft)
    return Curl_pp_flushsend(pp);

  do {
    /* Read the response from the server */
    result = Curl_pp_readresp(sock, pp, &imapcode, &nread);
    if(result)
      return result;

    /* Was there an error parsing the response line? */
    if(imapcode == -1)
      return CURLE_FTP_WEIRD_SERVER_REPLY;

    if(!imapcode)
      break;

    /* We have now received a full IMAP server response */
    switch(imapc->state) {
    case IMAP_SERVERGREET:
      result = imap_state_servergreet_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_CAPABILITY:
      result = imap_state_capability_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_STARTTLS:
      result = imap_state_starttls_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_AUTHENTICATE:
      result = imap_state_auth_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGIN:
      result = imap_state_login_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LIST:
      result = imap_state_list_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SELECT:
      result = imap_state_select_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH:
      result = imap_state_fetch_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_FETCH_FINAL:
      result = imap_state_fetch_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND:
      result = imap_state_append_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_APPEND_FINAL:
      result = imap_state_append_final_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_SEARCH:
      result = imap_state_search_resp(conn, imapcode, imapc->state);
      break;

    case IMAP_LOGOUT:
      /* fallthrough, just stop! */
    default:
      /* internal error */
      state(conn, IMAP_STOP);
      break;
    }
  } while(!result && imapc->state != IMAP_STOP && Curl_pp_moredata(pp));

  return result;
}